

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O1

string * __thiscall
Link::writeStatusChange_abi_cxx11_(string *__return_storage_ptr__,Link *this,int oldStatus)

{
  ostream *poVar1;
  stringstream local_1d0 [8];
  stringstream ss;
  ostream local_1c0 [112];
  ios_base local_150 [264];
  char *local_48;
  long local_40;
  char local_38 [16];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1c0,"    ",4);
  (*(this->super_Element)._vptr_Element[3])(&local_48,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1c0,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_Element).name._M_dataplus._M_p,
                      (this->super_Element).name._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,s_From_abi_cxx11_._M_dataplus._M_p,s_From_abi_cxx11_._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,linkStatusWords_abi_cxx11_[oldStatus]._M_dataplus._M_p,
                      linkStatusWords_abi_cxx11_[oldStatus]._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,s_To_abi_cxx11_._M_dataplus._M_p,s_To_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,linkStatusWords_abi_cxx11_[this->status]._M_dataplus._M_p,
             linkStatusWords_abi_cxx11_[this->status]._M_string_length);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::ios_base::~ios_base(local_150);
  return __return_storage_ptr__;
}

Assistant:

string Link::writeStatusChange(int oldStatus)
{
    stringstream ss;
    ss << "    " << typeStr() << " " <<
	    name << s_From << linkStatusWords[oldStatus] << s_To <<
	    linkStatusWords[status];
    return ss.str();
}